

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

int asmjit::rbAssert(RbNode *root)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RDI;
  bool bVar3;
  bool bVar4;
  int rh;
  int lh;
  RbNode *rn;
  RbNode *ln;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  int local_58;
  RbNode *root_00;
  int local_24;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_24 = 1;
  }
  else {
    root_00 = (RbNode *)*in_RDI;
    lVar1 = in_RDI[1];
    bVar3 = false;
    if (in_RDI != (undefined8 *)0x0) {
      bVar3 = *(int *)(in_RDI + 3) != 0;
    }
    bVar4 = false;
    if (bVar3) {
      bVar3 = false;
      if (root_00 != (RbNode *)0x0) {
        bVar3 = root_00->red != 0;
      }
      bVar4 = true;
      if ((!bVar3) && (bVar4 = false, lVar1 != 0)) {
        bVar4 = *(int *)(lVar1 + 0x18) != 0;
      }
    }
    if (bVar4) {
      DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
    }
    local_58 = rbAssert(root_00);
    iVar2 = rbAssert(root_00);
    bVar3 = true;
    if (root_00 != (RbNode *)0x0) {
      bVar3 = root_00->mem < (uint8_t *)in_RDI[2];
    }
    if (!bVar3) {
      DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
    }
    bVar3 = true;
    if (lVar1 != 0) {
      bVar3 = (ulong)in_RDI[2] < *(ulong *)(lVar1 + 0x10);
    }
    if (!bVar3) {
      DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
    }
    bVar3 = false;
    if ((local_58 != 0) && (bVar3 = false, iVar2 != 0)) {
      bVar3 = local_58 != iVar2;
    }
    if (bVar3) {
      DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
    }
    if ((local_58 == 0) || (iVar2 == 0)) {
      local_24 = 0;
    }
    else {
      bVar3 = false;
      if (in_RDI != (undefined8 *)0x0) {
        bVar3 = *(int *)(in_RDI + 3) != 0;
      }
      if (!bVar3) {
        local_58 = local_58 + 1;
      }
      local_24 = local_58;
    }
  }
  return local_24;
}

Assistant:

static int rbAssert(RbNode* root) noexcept {
  if (!root) return 1;

  RbNode* ln = root->node[0];
  RbNode* rn = root->node[1];

  // Red violation.
  ASMJIT_ASSERT(!(rbIsRed(root) && (rbIsRed(ln) || rbIsRed(rn))));

  int lh = rbAssert(ln);
  int rh = rbAssert(rn);

  // Invalid btree.
  ASMJIT_ASSERT(ln == nullptr || ln->mem < root->mem);
  ASMJIT_ASSERT(rn == nullptr || rn->mem > root->mem);

  // Black violation.
  ASMJIT_ASSERT(!(lh != 0 && rh != 0 && lh != rh));

  // Only count black links.
  if (lh != 0 && rh != 0)
    return rbIsRed(root) ? lh : lh + 1;
  else
    return 0;
}